

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,SPIRType *type,bool forward_declaration)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  pointer pcVar1;
  uint uVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  SPIRType *pSVar6;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *name;
  undefined7 in_register_00000011;
  ID *__k;
  long lVar7;
  __hashtable *__h_1;
  ulong uVar8;
  __node_gen_type __node_gen;
  string buffer_name;
  undefined1 local_98 [32];
  key_type local_78;
  TypedID<(spirv_cross::Types)1> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,forward_declaration) == 0) {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      (*(this->super_Compiler)._vptr_Compiler[6])
                (local_98,this,(ulong)(type->super_IVariant).self.id,0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_98,this,type,0);
    }
    ::std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_);
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      buffer_to_packing_standard_abi_cxx11_((string *)local_98,this,type,true);
      statement<char_const(&)[26],std::__cxx11::string,char_const(&)[10],std::__cxx11::string&>
                (this,(char (*) [26])"layout(buffer_reference, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (char (*) [10])0x2daa1b,&local_78);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    else {
      statement<char_const(&)[33],std::__cxx11::string&>
                (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_78);
    }
    statement<char_const(&)[2]>(this,(char (*) [2])"{");
    this->indent = this->indent + 1;
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(type->member_name_cache)._M_h);
      sVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar3 != 0) {
        local_58 = (type->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        lVar7 = sVar3 << 2;
        uVar8 = 0;
        do {
          add_member_name(this,type,(uint32_t)uVar8);
          uVar2 = local_58[uVar8].id;
          local_98._0_8_ = local_98 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
          (*(this->super_Compiler)._vptr_Compiler[0x15])
                    (this,type,(ulong)uVar2,uVar8 & 0xffffffff,local_98,0);
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_);
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + -4;
        } while (lVar7 != 0);
      }
    }
    else {
      pSVar6 = Compiler::get_pointee_type(&this->super_Compiler,type);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_98,this,pSVar6,0);
      (*(this->super_Compiler)._vptr_Compiler[0x23])(&local_50,this,pSVar6);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (char (*) [7])" value",&local_50,(char (*) [2])0x2d9bde);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x2d80a2);
  }
  else {
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])(local_98,this,(ulong)(type->super_IVariant).self.id)
    ;
    __k = &(type->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
    pcVar1 = local_98 + 0x10;
    if ((pointer)local_98._0_8_ != pcVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_Compiler).ir.meta,__k);
    if ((((pmVar4->decoration).alias._M_string_length == 0) ||
        (iVar5 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->block_ssbo_names)._M_h,&local_78),
        iVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar5 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->resource_names)._M_h,&local_78),
       iVar5.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_98,(spirv_cross *)0x2e3de5,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    variables_primary = &this->block_ssbo_names;
    name = &local_78;
    add_variable(this,variables_primary,&this->resource_names,name);
    if (local_78._M_string_length == 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_98,(spirv_cross *)0x2e3de5,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)name);
      ::std::__cxx11::string::operator=((string *)&local_78,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    local_98._0_8_ = &this->block_names;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_98._0_8_,&local_78);
    local_98._0_8_ = variables_primary;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)variables_primary,&local_78);
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_78,
               (char (*) [2])0x2d9bde);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(SPIRType &type, bool forward_declaration)
{
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		if (type.basetype == SPIRType::Struct)
			statement("layout(buffer_reference, ", buffer_to_packing_standard(type, true), ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}